

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameterization.cpp
# Opt level: O0

Parameterization * __thiscall Parameterization::GetName_abi_cxx11_(Parameterization *this)

{
  long in_RSI;
  Parameterization *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 8));
  return this;
}

Assistant:

string Parameterization::GetName() {
  return name;
}